

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_77::BinaryReaderIR::OnUnreachableExpr(BinaryReaderIR *this)

{
  Result RVar1;
  Expr *local_20;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  MakeUnique<wabt::ExprMixin<(wabt::ExprType)57>>();
  local_18._M_head_impl = local_20;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_18);
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnUnreachableExpr() {
  return AppendExpr(MakeUnique<UnreachableExpr>());
}